

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O0

int CivetServer::requestHandler(mg_connection *conn,void *cbdata)

{
  mg_request_info *pmVar1;
  int iVar2;
  mapped_type *this;
  CivetHandler *handler;
  CivetConnection local_58;
  byte local_35;
  uint local_34;
  bool status_ok;
  void *pvStack_30;
  int http_status_code;
  CivetServer *me;
  mg_request_info *request_info;
  void *cbdata_local;
  mg_connection *conn_local;
  
  request_info = (mg_request_info *)cbdata;
  cbdata_local = conn;
  me = (CivetServer *)mg_get_request_info(conn);
  pvStack_30 = ((mg_request_info *)me)->user_data;
  local_34 = 0xffffffff;
  local_35 = 0;
  if (*(long *)((long)pvStack_30 + 8) == 0) {
    conn_local._4_4_ = 0;
  }
  else {
    mg_lock_context(*(mg_context **)((long)pvStack_30 + 8));
    local_58.postData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Tp_alloc_type =
         (_Tp_alloc_type)0x0;
    local_58.postData.super__Vector_base<char,_std::allocator<char>_>._M_impl._1_7_ = 0;
    local_58.postData.super__Vector_base<char,_std::allocator<char>_>._M_impl._8_8_ = 0;
    local_58.postData.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = 0;
    CivetConnection::CivetConnection(&local_58);
    this = std::
           map<const_mg_connection_*,_CivetServer::CivetConnection,_std::less<const_mg_connection_*>,_std::allocator<std::pair<const_mg_connection_*const,_CivetServer::CivetConnection>_>_>
           ::operator[]((map<const_mg_connection_*,_CivetServer::CivetConnection,_std::less<const_mg_connection_*>,_std::allocator<std::pair<const_mg_connection_*const,_CivetServer::CivetConnection>_>_>
                         *)((long)pvStack_30 + 0x10),(key_type *)&cbdata_local);
    CivetConnection::operator=(this,&local_58);
    CivetConnection::~CivetConnection(&local_58);
    mg_unlock_context(*(mg_context **)((long)pvStack_30 + 8));
    pmVar1 = request_info;
    if (request_info != (mg_request_info *)0x0) {
      iVar2 = strcmp((char *)me->_vptr_CivetServer,"GET");
      if (iVar2 == 0) {
        local_35 = (**(code **)(pmVar1->request_method + 0x18))
                             (pmVar1,pvStack_30,cbdata_local,&local_34);
        local_35 = local_35 & 1;
        if ((int)local_34 < 0) {
          local_35 = (**(code **)(pmVar1->request_method + 0x10))(pmVar1,pvStack_30,cbdata_local);
          local_35 = local_35 & 1;
        }
      }
      else {
        iVar2 = strcmp((char *)me->_vptr_CivetServer,"POST");
        if (iVar2 == 0) {
          local_35 = (**(code **)(pmVar1->request_method + 0x28))
                               (pmVar1,pvStack_30,cbdata_local,&local_34);
          local_35 = local_35 & 1;
          if ((int)local_34 < 0) {
            local_35 = (**(code **)(pmVar1->request_method + 0x20))(pmVar1,pvStack_30,cbdata_local);
            local_35 = local_35 & 1;
          }
        }
        else {
          iVar2 = strcmp((char *)me->_vptr_CivetServer,"HEAD");
          if (iVar2 == 0) {
            local_35 = (**(code **)(pmVar1->request_method + 0x38))
                                 (pmVar1,pvStack_30,cbdata_local,&local_34);
            local_35 = local_35 & 1;
            if ((int)local_34 < 0) {
              local_35 = (**(code **)(pmVar1->request_method + 0x30))
                                   (pmVar1,pvStack_30,cbdata_local);
              local_35 = local_35 & 1;
            }
          }
          else {
            iVar2 = strcmp((char *)me->_vptr_CivetServer,"PUT");
            if (iVar2 == 0) {
              local_35 = (**(code **)(pmVar1->request_method + 0x48))
                                   (pmVar1,pvStack_30,cbdata_local,&local_34);
              local_35 = local_35 & 1;
              if ((int)local_34 < 0) {
                local_35 = (**(code **)(pmVar1->request_method + 0x40))
                                     (pmVar1,pvStack_30,cbdata_local);
                local_35 = local_35 & 1;
              }
            }
            else {
              iVar2 = strcmp((char *)me->_vptr_CivetServer,"DELETE");
              if (iVar2 == 0) {
                local_35 = (**(code **)(pmVar1->request_method + 0x58))
                                     (pmVar1,pvStack_30,cbdata_local,&local_34);
                local_35 = local_35 & 1;
                if ((int)local_34 < 0) {
                  local_35 = (**(code **)(pmVar1->request_method + 0x50))
                                       (pmVar1,pvStack_30,cbdata_local);
                  local_35 = local_35 & 1;
                }
              }
              else {
                iVar2 = strcmp((char *)me->_vptr_CivetServer,"OPTIONS");
                if (iVar2 == 0) {
                  local_35 = (**(code **)(pmVar1->request_method + 0x68))
                                       (pmVar1,pvStack_30,cbdata_local,&local_34);
                  local_35 = local_35 & 1;
                  if ((int)local_34 < 0) {
                    local_35 = (**(code **)(pmVar1->request_method + 0x60))
                                         (pmVar1,pvStack_30,cbdata_local);
                    local_35 = local_35 & 1;
                  }
                }
                else {
                  iVar2 = strcmp((char *)me->_vptr_CivetServer,"PATCH");
                  if (iVar2 == 0) {
                    local_35 = (**(code **)(pmVar1->request_method + 0x78))
                                         (pmVar1,pvStack_30,cbdata_local,&local_34);
                    local_35 = local_35 & 1;
                    if ((int)local_34 < 0) {
                      local_35 = (**(code **)(pmVar1->request_method + 0x70))
                                           (pmVar1,pvStack_30,cbdata_local);
                      local_35 = local_35 & 1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if ((int)local_34 < 0) {
      local_34 = (uint)((local_35 & 1) != 0);
    }
    conn_local._4_4_ = local_34;
  }
  return conn_local._4_4_;
}

Assistant:

int
CivetServer::requestHandler(struct mg_connection *conn, void *cbdata)
{
	const struct mg_request_info *request_info = mg_get_request_info(conn);
	assert(request_info != NULL);
	CivetServer *me = (CivetServer *)(request_info->user_data);
	assert(me != NULL);
	int http_status_code = -1;
	bool status_ok = false;

	// Happens when a request hits the server before the context is saved
	if (me->context == NULL)
		return 0;

	mg_lock_context(me->context);
	me->connections[conn] = CivetConnection();
	mg_unlock_context(me->context);

	CivetHandler *handler = (CivetHandler *)cbdata;

	if (handler) {
		if (strcmp(request_info->request_method, "GET") == 0) {
			status_ok = handler->handleGet(me, conn, &http_status_code);
			if (http_status_code < 0) {
				status_ok = handler->handleGet(me, conn);
			}
		} else if (strcmp(request_info->request_method, "POST") == 0) {
			status_ok = handler->handlePost(me, conn, &http_status_code);
			if (http_status_code < 0) {
				status_ok = handler->handlePost(me, conn);
			}
		} else if (strcmp(request_info->request_method, "HEAD") == 0) {
			status_ok = handler->handleHead(me, conn, &http_status_code);
			if (http_status_code < 0) {
				status_ok = handler->handleHead(me, conn);
			}
		} else if (strcmp(request_info->request_method, "PUT") == 0) {
			status_ok = handler->handlePut(me, conn, &http_status_code);
			if (http_status_code < 0) {
				status_ok = handler->handlePut(me, conn);
			}
		} else if (strcmp(request_info->request_method, "DELETE") == 0) {
			status_ok = handler->handleDelete(me, conn, &http_status_code);
			if (http_status_code < 0) {
				status_ok = handler->handleDelete(me, conn);
			}
		} else if (strcmp(request_info->request_method, "OPTIONS") == 0) {
			status_ok = handler->handleOptions(me, conn, &http_status_code);
			if (http_status_code < 0) {
				status_ok = handler->handleOptions(me, conn);
			}
		} else if (strcmp(request_info->request_method, "PATCH") == 0) {
			status_ok = handler->handlePatch(me, conn, &http_status_code);
			if (http_status_code < 0) {
				status_ok = handler->handlePatch(me, conn);
			}
		}
	}

	if (http_status_code < 0) {
		http_status_code = status_ok ? 1 : 0;
	}

	return http_status_code;
}